

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall
Generator_cellGeometryModelWithSomeConstantsAsExternalVariables_Test::TestBody
          (Generator_cellGeometryModelWithSomeConstantsAsExternalVariables_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__r;
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  AssertHelper local_3f8 [8];
  Message local_3f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  allocator<char> local_3c1;
  string local_3c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_360 [8];
  Message local_358 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  allocator<char> local_329;
  string local_328 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_3;
  Message local_2d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  allocator<char> local_2a1;
  string local_2a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_2;
  string local_248 [32];
  undefined1 local_228 [8];
  GeneratorProfilePtr profile;
  GeneratorPtr generator;
  AnalyserModelPtr analyserModel;
  Message local_1f0 [8];
  unsigned_long local_1e8 [2];
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_1;
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [32];
  shared_ptr<libcellml::Component> local_178;
  shared_ptr<libcellml::Variable> local_168;
  shared_ptr<libcellml::AnalyserExternalVariable> local_158;
  allocator<char> local_141;
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [32];
  shared_ptr<libcellml::Component> local_f8;
  shared_ptr<libcellml::Variable> local_e8;
  shared_ptr<libcellml::AnalyserExternalVariable> local_d8;
  undefined1 local_c8 [8];
  AnalyserPtr analyser;
  Message local_b0 [8];
  unsigned_long local_a8 [2];
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  Generator_cellGeometryModelWithSomeConstantsAsExternalVariables_Test *this_local;
  
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"generator/cell_geometry_model/model.cellml",&local_71);
  fileContents(local_50);
  libcellml::Parser::parseModel((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  local_a8[1] = 0;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_a8[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_98,"size_t(0)","parser->issueCount()",local_a8 + 1,local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x43c,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_b0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  libcellml::Analyser::create();
  peVar3 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_c8);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"cell_geometry",&local_119);
  libcellml::ComponentEntity::component((string *)&local_f8,SUB81(peVar4,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"L",&local_141);
  libcellml::Component::variable((string *)&local_e8);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&local_d8);
  libcellml::Analyser::addExternalVariable((shared_ptr *)peVar3);
  std::shared_ptr<libcellml::AnalyserExternalVariable>::~shared_ptr(&local_d8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_e8);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_f8);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  peVar3 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_c8);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_198,"cell_geometry",&local_199);
  libcellml::ComponentEntity::component((string *)&local_178,SUB81(peVar4,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c0,"rad",(allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  libcellml::Component::variable((string *)&local_168);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&local_158);
  libcellml::Analyser::addExternalVariable((shared_ptr *)peVar3);
  std::shared_ptr<libcellml::AnalyserExternalVariable>::~shared_ptr(&local_158);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_168);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_178);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  peVar3 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_c8);
  libcellml::Analyser::analyseModel((shared_ptr *)peVar3);
  local_1e8[1] = 0;
  std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_c8);
  local_1e8[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1d8,"size_t(0)","analyser->errorCount()",local_1e8 + 1,
             local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(local_1f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &analyserModel.
                super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x445,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &analyserModel.
                super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,local_1f0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &analyserModel.
                super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    testing::Message::~Message(local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_c8);
  libcellml::Analyser::model();
  libcellml::Generator::create();
  peVar5 = std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&profile.
                            super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  libcellml::Generator::setModel((shared_ptr *)peVar5);
  std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Generator::profile();
  peVar6 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_248,"model.external.h",(allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
  libcellml::GeneratorProfile::setInterfaceFileNameString((string *)peVar6);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a0,"generator/cell_geometry_model/model.external.h",&local_2a1);
  fileContents((string *)&local_280);
  std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Generator::interfaceCode_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_260,
             "fileContents(\"generator/cell_geometry_model/model.external.h\")",
             "generator->interfaceCode()",&local_280,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(local_2d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x450,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_328,"generator/cell_geometry_model/model.external.c",&local_329);
  fileContents((string *)&local_308);
  std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_2e8,
             "fileContents(\"generator/cell_geometry_model/model.external.c\")",
             "generator->implementationCode()",&local_308,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator(&local_329);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(local_358);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              (local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x451,pcVar2);
    testing::internal::AssertHelper::operator=(local_360,local_358);
    testing::internal::AssertHelper::~AssertHelper(local_360);
    testing::Message::~Message(local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  __r = &gtest_ar_4.message_;
  libcellml::GeneratorProfile::create((Profile)__r);
  std::shared_ptr<libcellml::GeneratorProfile>::operator=
            ((shared_ptr<libcellml::GeneratorProfile> *)local_228,
             (shared_ptr<libcellml::GeneratorProfile> *)__r);
  std::shared_ptr<libcellml::GeneratorProfile>::~shared_ptr
            ((shared_ptr<libcellml::GeneratorProfile> *)__r);
  peVar5 = std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&profile.
                            super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  libcellml::Generator::setProfile((shared_ptr *)peVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3c0,"generator/cell_geometry_model/model.external.py",&local_3c1);
  fileContents((string *)&local_3a0);
  std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_380,
             "fileContents(\"generator/cell_geometry_model/model.external.py\")",
             "generator->implementationCode()",&local_3a0,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(local_3f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              (local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x457,pcVar2);
    testing::internal::AssertHelper::operator=(local_3f8,local_3f0);
    testing::internal::AssertHelper::~AssertHelper(local_3f8);
    testing::Message::~Message(local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  std::shared_ptr<libcellml::GeneratorProfile>::~shared_ptr
            ((shared_ptr<libcellml::GeneratorProfile> *)local_228);
  std::shared_ptr<libcellml::Generator>::~shared_ptr
            ((shared_ptr<libcellml::Generator> *)
             &profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::AnalyserModel>::~shared_ptr
            ((shared_ptr<libcellml::AnalyserModel> *)
             &generator.super___shared_ptr<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Analyser>::~shared_ptr((shared_ptr<libcellml::Analyser> *)local_c8);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Generator, cellGeometryModelWithSomeConstantsAsExternalVariables)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/cell_geometry_model/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();

    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(model->component("cell_geometry")->variable("L")));
    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(model->component("cell_geometry")->variable("rad")));

    analyser->analyseModel(model);

    EXPECT_EQ(size_t(0), analyser->errorCount());

    auto analyserModel = analyser->model();
    auto generator = libcellml::Generator::create();

    generator->setModel(analyserModel);

    auto profile = generator->profile();

    profile->setInterfaceFileNameString("model.external.h");

    EXPECT_EQ(fileContents("generator/cell_geometry_model/model.external.h"), generator->interfaceCode());
    EXPECT_EQ(fileContents("generator/cell_geometry_model/model.external.c"), generator->implementationCode());

    profile = libcellml::GeneratorProfile::create(libcellml::GeneratorProfile::Profile::PYTHON);

    generator->setProfile(profile);

    EXPECT_EQ(fileContents("generator/cell_geometry_model/model.external.py"), generator->implementationCode());
}